

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

bool __thiscall Hospital::validate_String_Must_Be_character(Hospital *this,string *name)

{
  ulong uVar1;
  byte *pbVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = name->_M_string_length;
  bVar5 = uVar1 == 0;
  if ((!bVar5) &&
     (pbVar2 = (byte *)(name->_M_dataplus)._M_p, (byte)((*pbVar2 & 0xdf) + 0xbf) < 0x1a)) {
    uVar4 = 0;
    do {
      if (uVar1 - 1 == uVar4) {
        return true;
      }
      lVar3 = uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while ((byte)((pbVar2[lVar3] & 0xdf) + 0xbf) < 0x1a);
    bVar5 = uVar1 <= uVar4;
  }
  return bVar5;
}

Assistant:

bool Hospital::validate_String_Must_Be_character(string name) {
    int countr = 0;
    for (int i = 0; i <name.length() ; ++i) {
        if((name[i]>=65 && name[i]<=90) || (name[i]>=97 && name[i]<=122) )countr ++;
        else {
            return false;
        }
    }
    if(countr == name.length())return true ;
}